

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O1

bool __thiscall HEkk::rebuildRefactor(HEkk *this,HighsInt rebuild_reason)

{
  double dVar1;
  bool bVar2;
  double dVar3;
  
  if ((this->info_).update_count == 0) {
    return false;
  }
  bVar2 = true;
  if ((((this->options_->super_HighsOptionsStruct).no_unnecessary_rebuild_refactor == true) &&
      ((uint)rebuild_reason < 9)) && ((0x179U >> (rebuild_reason & 0x1fU) & 1) != 0)) {
    dVar1 = (this->options_->super_HighsOptionsStruct).rebuild_refactor_solution_error_tolerance;
    if (dVar1 <= 0.0) {
      return false;
    }
    dVar3 = factorSolveError(this);
    bVar2 = dVar1 < dVar3;
  }
  return bVar2;
}

Assistant:

bool HEkk::rebuildRefactor(HighsInt rebuild_reason) {
  // If no updates have been performed, then don't refactor!
  if (info_.update_count == 0) return false;
  // Otherwise, refactor by default
  bool refactor = true;
  double solution_error = 0;
  if (options_->no_unnecessary_rebuild_refactor) {
    // Consider whether not to refactor in rebuild
    //
    // Must have an INVERT just to consider this!
    assert(status_.has_invert);
    if (rebuild_reason == kRebuildReasonNo ||
        rebuild_reason == kRebuildReasonPossiblyOptimal ||
        rebuild_reason == kRebuildReasonPossiblyPhase1Feasible ||
        rebuild_reason == kRebuildReasonPossiblyPrimalUnbounded ||
        rebuild_reason == kRebuildReasonPossiblyDualUnbounded ||
        rebuild_reason == kRebuildReasonPrimalInfeasibleInPrimalSimplex) {
      // By default, don't refactor!
      refactor = false;
      // Possibly revise the decision based on accuracy when solving a
      // test system
      const double error_tolerance =
          options_->rebuild_refactor_solution_error_tolerance;
      if (error_tolerance > 0) {
        solution_error = factorSolveError();
        refactor = solution_error > error_tolerance;
      }
    }
  }
  const bool report_refactorization = false;
  if (report_refactorization) {
    const std::string logic = refactor ? "   " : "no   ";
    if (info_.update_count &&
        rebuild_reason != kRebuildReasonSyntheticClockSaysInvert)
      printf(
          "%srefactorization after %4d updates and solution error = %11.4g for "
          "rebuild reason = %s\n",
          logic.c_str(), (int)info_.update_count, solution_error,
          rebuildReason(rebuild_reason).c_str());
  }
  return refactor;
}